

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::Path::evalWin32(Path *__return_storage_ptr__,Path *this,StringPtr pathText)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  undefined1 in_R9B;
  String *p;
  String *params;
  StringPtr path;
  StringPtr path_00;
  Vector<kj::String> newParts;
  ArrayBuilder<kj::String> local_50;
  
  path_00.content.ptr = (char *)pathText.content.size_;
  path.content.size_ = (Vector<kj::String> *)pathText.content.ptr;
  sVar1 = (this->parts).size_;
  path.content.ptr = path_00.content.ptr;
  sVar2 = countPartsWin32((Path *)path.content.size_,path);
  sVar2 = sVar2 + sVar1;
  local_50.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar2);
  local_50.endPtr = local_50.ptr + sVar2;
  local_50.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  params = (this->parts).ptr;
  local_50.pos = local_50.ptr;
  for (lVar3 = (this->parts).size_ * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_50,params);
    params = params + 1;
  }
  path_00.content.size_ = 0;
  evalWin32Impl(__return_storage_ptr__,(Path *)&local_50,path.content.size_,path_00,(bool)in_R9B);
  ArrayBuilder<kj::String>::dispose(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalWin32(StringPtr pathText) && {
  Vector<String> newParts(parts.size() + countPartsWin32(pathText));
  for (auto& p: parts) newParts.add(kj::mv(p));
  return evalWin32Impl(kj::mv(newParts), pathText);
}